

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O3

Vector2f __thiscall Rml::Box::GetSize(Box *this,BoxArea area)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  long lVar4;
  float *pfVar5;
  Vector2f VVar6;
  float fVar7;
  
  if (area == Auto) {
    bVar3 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x3b);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    VVar6 = this->content;
  }
  else {
    VVar6 = this->content;
    if ((int)area < 3) {
      lVar4 = (long)(int)area;
      pfVar5 = this->area_edges[lVar4 + -1] + 2;
      do {
        lVar4 = lVar4 + 1;
        uVar1 = *(undefined8 *)(pfVar5 + 4);
        fVar7 = VVar6.y;
        VVar6.x = VVar6.x + (float)((ulong)uVar1 >> 0x20) +
                            (float)((ulong)*(undefined8 *)(pfVar5 + 2) >> 0x20);
        VVar6.y = fVar7 + (float)uVar1 + (float)*(undefined8 *)(pfVar5 + 2);
        pfVar5 = pfVar5 + 4;
      } while ((int)lVar4 != 3);
    }
  }
  return VVar6;
}

Assistant:

Vector2f Box::GetSize(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_size(content);
	for (int i = (int)area; i <= (int)BoxArea::Padding; i++)
	{
		area_size.x += (area_edges[i][(int)BoxEdge::Left] + area_edges[i][(int)BoxEdge::Right]);
		area_size.y += (area_edges[i][(int)BoxEdge::Top] + area_edges[i][(int)BoxEdge::Bottom]);
	}

	return area_size;
}